

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteCryptedDescriptorKey
          (WalletBatch *this,uint256 *desc_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *secret)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [72];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128 = *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  uStack_120 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_118 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_110 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  memcpy(local_108,pubkey,0x41);
  paVar1 = &local_c0.first.field_2;
  local_c0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,DBKeys::WALLETDESCRIPTORCKEY_abi_cxx11_,
             DAT_013d5198 + DBKeys::WALLETDESCRIPTORCKEY_abi_cxx11_);
  memcpy(&local_c0.second,&local_128,0x61);
  bVar2 = WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&local_c0,secret,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar2) {
    local_128 = *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
    uStack_120 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
    local_118 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_110 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
    memcpy(local_108,pubkey,0x41);
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,DBKeys::WALLETDESCRIPTORKEY_abi_cxx11_,
               DAT_013d51b8 + DBKeys::WALLETDESCRIPTORKEY_abi_cxx11_);
    memcpy(&local_c0.second,&local_128,0x61);
    EraseIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>>(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteCryptedDescriptorKey(const uint256& desc_id, const CPubKey& pubkey, const std::vector<unsigned char>& secret)
{
    if (!WriteIC(std::make_pair(DBKeys::WALLETDESCRIPTORCKEY, std::make_pair(desc_id, pubkey)), secret, false)) {
        return false;
    }
    EraseIC(std::make_pair(DBKeys::WALLETDESCRIPTORKEY, std::make_pair(desc_id, pubkey)));
    return true;
}